

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O2

int flatcc_builder_check_required(flatcc_builder_t *B,flatbuffers_voffset_t *required,int count)

{
  ushort *puVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (B->frame->type != 3) {
    __assert_fail("(B->frame[0].type) == flatcc_builder_table",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x526,
                  "int flatcc_builder_check_required(flatcc_builder_t *, const flatbuffers_voffset_t *, int)"
                 );
  }
  if (count <= (int)(uint)B->id_end) {
    uVar2 = 0;
    uVar3 = (ulong)(uint)count;
    if (count < 1) {
      uVar3 = uVar2;
    }
    do {
      if (uVar3 == uVar2) {
        return 1;
      }
      puVar1 = required + uVar2;
      uVar2 = uVar2 + 1;
    } while (B->vs[*puVar1] != 0);
  }
  return 0;
}

Assistant:

int flatcc_builder_check_required(flatcc_builder_t *B, const flatbuffers_voffset_t *required, int count)
{
    int i;

    check(frame(type) == flatcc_builder_table, "expected table frame");

    if (B->id_end < count) {
        return 0;
    }
    for (i = 0; i < count; ++i) {
        if (B->vs[required[i]] == 0) {
            return 0;
        }
    }
    return 1;
}